

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

UniValue * __thiscall
RPCHelpMan::Arg<UniValue>(UniValue *__return_storage_ptr__,RPCHelpMan *this,string_view key)

{
  long lVar1;
  size_t i;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  i = GetParamIndex(this,key);
  pUVar2 = ArgValue<UniValue_const&>(this,i);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    UniValue::UniValue(__return_storage_ptr__,pUVar2);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

auto Arg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return argument (required or with default value).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value.
            return ArgValue<R>(i);
        } else {
            // Return everything else by reference.
            return ArgValue<const R&>(i);
        }
    }